

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::fwrite_fully(void *ptr,size_t size,size_t count,FILE *stream)

{
  int error_code;
  system_error *this;
  int *piVar1;
  string_view local_40;
  FILE *local_30;
  size_t written;
  FILE *stream_local;
  size_t count_local;
  size_t size_local;
  void *ptr_local;
  
  written = (size_t)stream;
  stream_local = (FILE *)count;
  count_local = size;
  size_local = (size_t)ptr;
  local_30 = (FILE *)fwrite(ptr,size,count,(FILE *)stream);
  if (local_30 < stream_local) {
    this = (system_error *)__cxa_allocate_exception(0x18);
    piVar1 = __errno_location();
    error_code = *piVar1;
    basic_string_view<char>::basic_string_view(&local_40,"cannot write to file");
    system_error::system_error<>(this,error_code,local_40);
    __cxa_throw(this,&system_error::typeinfo,system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_fully(const void* ptr, size_t size, size_t count,
                         FILE* stream) {
  size_t written = std::fwrite(ptr, size, count, stream);
  if (written < count) FMT_THROW(system_error(errno, "cannot write to file"));
}